

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdCreateAddress(void *handle,int hash_type,char *pubkey,char *redeem_script,int network_type,
                    char **address,char **locking_script,char **p2sh_segwit_locking_script)

{
  bool bVar1;
  undefined8 uVar2;
  ElementsAddressFactory *in_RCX;
  string *in_RDX;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  CfdException *except;
  exception *std_except;
  ElementsAddressFactory factory_1;
  Script *in_stack_000003c8;
  Script *in_stack_000003d0;
  Pubkey *in_stack_000003d8;
  AddressType in_stack_000003e4;
  AddressFactory *in_stack_000003e8;
  Script *in_stack_00000400;
  AddressFactory factory;
  Script unlocking_script;
  Script lock_script;
  Script script;
  Pubkey pubkey_obj;
  AddressType addr_type;
  Address addr;
  NetType net_type;
  bool is_bitcoin;
  char *work_p2sh_segwit_locking_script;
  char *work_locking_script;
  char *work_address;
  int result;
  undefined8 in_stack_fffffffffffff768;
  NetType type;
  Address *in_stack_fffffffffffff770;
  string *in_stack_fffffffffffff780;
  undefined8 in_stack_fffffffffffff788;
  CfdError error_code;
  undefined7 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff797;
  undefined8 in_stack_fffffffffffff7a8;
  NetType type_00;
  ElementsAddressFactory *in_stack_fffffffffffff7b0;
  bool *in_stack_fffffffffffff7c8;
  allocator *paVar3;
  string *in_stack_fffffffffffff7d0;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  Address local_790;
  Address local_5f0;
  allocator local_449;
  string local_448;
  Script local_428;
  allocator local_3e9;
  string local_3e8;
  Pubkey local_3c8;
  allocator local_3a9;
  string local_3a8;
  SchnorrPubkey local_388;
  ByteData local_370;
  allocator local_351;
  string local_350;
  ByteData local_330;
  ByteData local_318;
  Pubkey local_300;
  Script local_2e8;
  Script local_2b0;
  Script local_278;
  Pubkey local_240;
  AddressType local_224;
  Address local_220;
  NetType local_a8;
  byte local_a3;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  ElementsAddressFactory *local_28;
  string *local_20;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff788 >> 0x20);
  type_00 = (NetType)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
  type = (NetType)((ulong)in_stack_fffffffffffff768 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  if (local_38 != (undefined8 *)0x0) {
    local_a3 = 0;
    local_a8 = cfd::capi::ConvertNetType
                         ((int)((ulong)in_stack_fffffffffffff7d0 >> 0x20),in_stack_fffffffffffff7c8)
    ;
    cfd::core::Address::Address(&local_220);
    local_224 = cfd::capi::ConvertHashToAddressType((int)((ulong)in_stack_fffffffffffff7d0 >> 0x20))
    ;
    cfd::core::Pubkey::Pubkey(&local_240);
    cfd::core::Script::Script(&local_278);
    cfd::core::Script::Script(&local_2b0);
    cfd::core::Script::Script(&local_2e8);
    if ((local_20 != (string *)0x0) && (local_20->_M_dataplus != (_Alloc_hider)0x0)) {
      if (local_224 == kTaprootAddress) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_350,"02",&local_351);
        cfd::core::ByteData::ByteData(&local_330,&local_350);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3a8,(char *)local_20,&local_3a9);
        cfd::core::SchnorrPubkey::SchnorrPubkey(&local_388,&local_3a8);
        cfd::core::SchnorrPubkey::GetData(&local_370,&local_388);
        cfd::core::ByteData::Concat<cfd::core::ByteData>(&local_318,&local_330,&local_370);
        cfd::core::Pubkey::Pubkey(&local_300,&local_318);
        cfd::core::Pubkey::operator=(&local_240,&local_300);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x57e337);
        cfd::core::ByteData::~ByteData((ByteData *)0x57e344);
        cfd::core::ByteData::~ByteData((ByteData *)0x57e351);
        cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x57e35e);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        cfd::core::ByteData::~ByteData((ByteData *)0x57e385);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        in_stack_fffffffffffff7d0 = local_20;
      }
      else {
        paVar3 = &local_3e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3e8,(char *)local_20,paVar3);
        cfd::core::Pubkey::Pubkey(&local_3c8,&local_3e8);
        cfd::core::Pubkey::operator=(&local_240,&local_3c8);
        cfd::core::Pubkey::~Pubkey((Pubkey *)0x57e587);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      }
    }
    if ((local_28 != (ElementsAddressFactory *)0x0) &&
       (*(char *)&(local_28->super_AddressFactory)._vptr_AddressFactory != '\0')) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_448,(char *)local_28,&local_449);
      cfd::core::Script::Script(&local_428,&local_448);
      cfd::core::Script::operator=(&local_278,&local_428);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff770);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      in_stack_fffffffffffff7b0 = local_28;
    }
    if ((local_a3 & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_fffffffffffff7b0,type_00);
      cfd::AddressFactory::CreateAddress
                (in_stack_000003e8,in_stack_000003e4,in_stack_000003d8,in_stack_000003d0,
                 in_stack_000003c8,in_stack_00000400);
      cfd::core::Address::operator=(&local_220,&local_790);
      cfd::core::Address::~Address(in_stack_fffffffffffff770);
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x57e897);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)in_stack_fffffffffffff770,type);
      cfd::AddressFactory::CreateAddress
                (in_stack_000003e8,in_stack_000003e4,in_stack_000003d8,in_stack_000003d0,
                 in_stack_000003c8,in_stack_00000400);
      cfd::core::Address::operator=(&local_220,&local_5f0);
      cfd::core::Address::~Address(in_stack_fffffffffffff770);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x57e7a5);
    }
    cfd::core::Address::GetAddress_abi_cxx11_(&local_7b0,&local_220);
    local_48 = cfd::capi::CreateString(in_stack_fffffffffffff7d0);
    std::__cxx11::string::~string((string *)&local_7b0);
    if ((in_stack_00000008 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_2b0), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_7d0,&local_2b0);
      local_50 = cfd::capi::CreateString(in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string((string *)&local_7d0);
    }
    if ((in_stack_00000010 != (undefined8 *)0x0) &&
       (bVar1 = cfd::core::Script::IsEmpty(&local_2e8), !bVar1)) {
      cfd::core::Script::GetHex_abi_cxx11_(&local_7f0,&local_2e8);
      local_58 = cfd::capi::CreateString(in_stack_fffffffffffff7d0);
      std::__cxx11::string::~string((string *)&local_7f0);
    }
    *local_38 = local_48;
    if (local_50 != (char *)0x0) {
      *in_stack_00000008 = local_50;
    }
    if (local_58 != (char *)0x0) {
      *in_stack_00000010 = local_58;
    }
    local_4 = 0;
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff770);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff770);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffff770);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x57eb15);
    cfd::core::Address::~Address(in_stack_fffffffffffff770);
    return local_4;
  }
  local_80.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               ,0x2f);
  local_80.filename = local_80.filename + 1;
  local_80.line = 0x8f;
  local_80.funcname = "CfdCreateAddress";
  cfd::core::logger::warn<>(&local_80,"address is null.");
  local_a2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"Failed to parameter. address is null.",&local_a1);
  cfd::core::CfdException::CfdException
            ((CfdException *)CONCAT17(in_stack_fffffffffffff797,in_stack_fffffffffffff790),
             error_code,in_stack_fffffffffffff780);
  local_a2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateAddress(
    void* handle, int hash_type, const char* pubkey, const char* redeem_script,
    int network_type, char** address, char** locking_script,
    char** p2sh_segwit_locking_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_address = nullptr;
  char* work_locking_script = nullptr;
  char* work_p2sh_segwit_locking_script = nullptr;
  try {
    cfd::Initialize();
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Address addr;
    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Pubkey pubkey_obj;
    Script script;
    Script lock_script;
    Script unlocking_script;

    if ((pubkey != nullptr) && (*pubkey != '\0')) {
      if (addr_type == AddressType::kTaprootAddress) {
        pubkey_obj =
            Pubkey(ByteData("02").Concat(SchnorrPubkey(pubkey).GetData()));
      } else {
        pubkey_obj = Pubkey(pubkey);
      }
    }
    if ((redeem_script != nullptr) && (*redeem_script != '\0')) {
      script = Script(redeem_script);
    }

    if (is_bitcoin) {
      AddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory factory(net_type);
      addr = factory.CreateAddress(
          addr_type, &pubkey_obj, &script, &lock_script, &unlocking_script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    work_address = CreateString(addr.GetAddress());
    if (locking_script != nullptr) {
      if (!lock_script.IsEmpty()) {
        work_locking_script = CreateString(lock_script.GetHex());
      }
    }
    if (p2sh_segwit_locking_script != nullptr) {
      if (!unlocking_script.IsEmpty()) {
        work_p2sh_segwit_locking_script =
            CreateString(unlocking_script.GetHex());
      }
    }

    *address = work_address;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_p2sh_segwit_locking_script != nullptr)
      *p2sh_segwit_locking_script = work_p2sh_segwit_locking_script;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_address, &work_locking_script, &work_p2sh_segwit_locking_script);
  return result;
}